

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

bool Diligent::ValidateResourceViewDimension<Diligent::IBufferView>
               (char *ResName,Uint32 ArraySize,Uint32 ArrayInd,IBufferView *pViewImpl,
               RESOURCE_DIMENSION ExpectedResourceDim,bool IsMultisample)

{
  int iVar1;
  undefined4 extraout_var;
  char (*Args_8) [2];
  Uint32 ArrayIndex;
  undefined7 in_register_00000081;
  Char *local_70;
  String local_68;
  string msg;
  
  ArrayIndex = (Uint32)CONCAT71(in_register_00000081,ExpectedResourceDim);
  if (RESOURCE_DIM_BUFFER < ExpectedResourceDim) {
    iVar1 = (*(pViewImpl->super_IDeviceObject).super_IObject._vptr_IObject[4])(pViewImpl);
    GetShaderResourcePrintName_abi_cxx11_
              (&local_68,(Diligent *)ResName,(char *)(ulong)ArraySize,ArrayInd,ArrayIndex);
    Args_8 = (char (*) [2])GetResourceDimString(RESOURCE_DIM_BUFFER);
    local_70 = GetResourceDimString(ExpectedResourceDim);
    FormatString<char[33],char_const*,char[22],std::__cxx11::string,char[6],char_const*,char[52],char_const*,char[2]>
              (&msg,(Diligent *)"The dimension of resource view \'",
               (char (*) [33])CONCAT44(extraout_var,iVar1),(char **)"\' bound to variable \'",
               (char (*) [22])&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\' is ",
               (char (*) [6])&stack0xffffffffffffff88,
               (char **)", but resource dimension expected by the shader is ",
               (char (*) [52])&local_70,(char **)0x7f04ea,Args_8);
    std::__cxx11::string::~string((string *)&local_68);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateResourceViewDimension",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x177);
    std::__cxx11::string::~string((string *)&msg);
  }
  return ExpectedResourceDim < RESOURCE_DIM_TEX_1D;
}

Assistant:

bool ValidateResourceViewDimension(const char*                ResName,
                                   Uint32                     ArraySize,
                                   Uint32                     ArrayInd,
                                   const TextureViewImplType* pViewImpl,
                                   RESOURCE_DIMENSION         ExpectedResourceDim,
                                   bool                       IsMultisample)
{
    bool BindingsOK = true;

    if (ExpectedResourceDim != RESOURCE_DIM_UNDEFINED)
    {
        const RESOURCE_DIMENSION ResourceDim = GetResourceViewDimension(pViewImpl);
        if (ResourceDim != ExpectedResourceDim)
        {
            RESOURCE_VALIDATION_FAILURE("The dimension of resource view '", pViewImpl->GetDesc().Name,
                                        "' bound to variable '", GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is ", GetResourceDimString(ResourceDim),
                                        ", but resource dimension expected by the shader is ", GetResourceDimString(ExpectedResourceDim), ".");
            BindingsOK = false;
        }

        if (ResourceDim == RESOURCE_DIM_TEX_2D || ResourceDim == RESOURCE_DIM_TEX_2D_ARRAY)
        {
            Uint32 SampleCount = GetResourceSampleCount(pViewImpl);
            if (IsMultisample && SampleCount == 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: multisample texture is expected.");
                BindingsOK = false;
            }
            else if (!IsMultisample && SampleCount > 1)
            {
                RESOURCE_VALIDATION_FAILURE("Texture view '", pViewImpl->GetDesc().Name, "' bound to variable '",
                                            GetShaderResourcePrintName(ResName, ArraySize, ArrayInd), "' is invalid: single-sample texture is expected.");
                BindingsOK = false;
            }
        }
    }

    return BindingsOK;
}